

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O0

SortedRun * __thiscall OnDiskIndex::get_run(OnDiskIndex *this,uint64_t ptr,uint64_t next_ptr)

{
  runtime_error *this_00;
  uchar *puVar1;
  ulong in_RCX;
  ulong in_RDX;
  ulong *in_RSI;
  SortedRun *in_RDI;
  __off_t in_R8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> run_bytes;
  uint64_t run_length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff68;
  SortedRun *pSVar2;
  allocator_type *__a;
  size_type in_stack_ffffffffffffff88;
  allocator_type local_51 [41];
  void *local_28;
  ulong local_18;
  
  local_28 = (void *)(in_RCX - in_RDX);
  if ((in_RDX <= in_RCX) && (in_RCX <= *in_RSI)) {
    __a = local_51;
    pSVar2 = in_RDI;
    local_18 = in_RDX;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x19d17f);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pSVar2,
               in_stack_ffffffffffffff88,__a);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x19d19f);
    pSVar2 = (SortedRun *)(in_RSI + 0xd);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19d1b7);
    RawFile::pread((RawFile *)pSVar2,(int)puVar1,local_28,local_18,in_R8);
    SortedRun::SortedRun(pSVar2,in_stack_ffffffffffffff68);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
    return in_RDI;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"internal error: index is corrupted, invalid run");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SortedRun OnDiskIndex::get_run(uint64_t ptr, uint64_t next_ptr) const {
    uint64_t run_length = next_ptr - ptr;

    if (ptr > next_ptr || next_ptr > index_size) {
        // TODO() - Which index? Which run?
        throw std::runtime_error(
            "internal error: index is corrupted, invalid run");
    }

    std::vector<uint8_t> run_bytes(run_length);
    ndxfile.pread(run_bytes.data(), run_length, ptr);
    return SortedRun(std::move(run_bytes));
}